

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O1

QDataStream * operator<<(QDataStream *s,QUuid *id)

{
  uint uVar1;
  qint64 qVar2;
  long in_FS_OFFSET;
  ulong local_28;
  undefined8 uStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (s->noswap == false) {
    uVar1 = id->data1;
    uStack_20 = *(undefined8 *)id->data4;
    local_28 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18) |
               (ulong)(ushort)(id->data2 << 8 | id->data2 >> 8) << 0x20 |
               (ulong)(ushort)(id->data3 << 8 | id->data3 >> 8) << 0x30;
  }
  else {
    local_28._0_4_ = id->data1;
    local_28._4_2_ = id->data2;
    local_28._6_2_ = id->data3;
    uStack_20 = *(undefined8 *)id->data4;
  }
  qVar2 = QDataStream::writeRawData(s,(char *)&local_28,0x10);
  if (qVar2 != 0x10) {
    QDataStream::setStatus(s,WriteFailed);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QUuid &id)
{
    constexpr int NumBytes = sizeof(QUuid);
    static_assert(NumBytes == 16, "Change the serialization format when this ever hits");
    char bytes[NumBytes];
    if (s.byteOrder() == QDataStream::BigEndian) {
        const auto id128 = id.toBytes();
        static_assert(sizeof(id128) == NumBytes);
        memcpy(bytes, &id128, NumBytes);
    } else {
        auto *data = bytes;

        // for historical reasons, our little-endian serialization format
        // stores each of the UUID fields in little endian, instead of storing
        // a little endian Id128
        qToLittleEndian(id.data1, data);
        data += sizeof(quint32);
        qToLittleEndian(id.data2, data);
        data += sizeof(quint16);
        qToLittleEndian(id.data3, data);
        data += sizeof(quint16);

        for (int i = 0; i < 8; ++i) {
            *(data) = id.data4[i];
            data++;
        }
    }

    if (s.writeRawData(bytes, NumBytes) != NumBytes)
        s.setStatus(QDataStream::WriteFailed);

    return s;
}